

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O2

bool __thiscall
cmCTest::RunCommand(cmCTest *this,
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *args,string *stdOut,string *stdErr,int *retVal,char *dir,cmDuration timeout,
                   Encoding encoding)

{
  pointer pbVar1;
  uint uVar2;
  int iVar3;
  cmsysProcess *cp;
  char *pcVar4;
  ostream *poVar5;
  string *a;
  pointer pbVar6;
  bool bVar7;
  cmProcessOutput processOutput;
  int length;
  string *local_2b8;
  cmCTest *local_2b0;
  vector<char,_std::allocator<char>_> tempError;
  vector<char,_std::allocator<char>_> tempOutput;
  char *data;
  int *local_268;
  string *local_260;
  char *local_258 [4];
  vector<const_char_*,_std::allocator<const_char_*>_> argv;
  string strdata;
  _Vector_base<char,_std::allocator<char>_> local_1f8;
  _Vector_base<char,_std::allocator<char>_> local_1e0;
  string local_1c8;
  ostringstream cmCTestLog_msg;
  
  argv.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  argv.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  argv.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2b8 = stdErr;
  local_2b0 = this;
  local_268 = retVal;
  local_260 = stdOut;
  std::vector<const_char_*,_std::allocator<const_char_*>_>::reserve
            (&argv,((long)(args->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_finish -
                    (long)(args->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start >> 5) + 1);
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (pbVar6 = (args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start; pbVar6 != pbVar1; pbVar6 = pbVar6 + 1) {
    _cmCTestLog_msg = (pbVar6->_M_dataplus)._M_p;
    std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
              ((vector<char_const*,std::allocator<char_const*>> *)&argv,(char **)&cmCTestLog_msg);
  }
  _cmCTestLog_msg = (pointer)0x0;
  std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
            ((vector<char_const*,std::allocator<char_const*>> *)&argv,(char **)&cmCTestLog_msg);
  local_260->_M_string_length = 0;
  *(local_260->_M_dataplus)._M_p = '\0';
  local_2b8->_M_string_length = 0;
  *(local_2b8->_M_dataplus)._M_p = '\0';
  cp = cmsysProcess_New();
  cmsysProcess_SetCommand
            (cp,argv.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                super__Vector_impl_data._M_start);
  cmsysProcess_SetWorkingDirectory(cp,dir);
  if (cmSystemTools::s_RunCommandHideConsole == true) {
    cmsysProcess_SetOption(cp,0,1);
  }
  cmsysProcess_SetTimeout(cp,timeout.__r);
  cmsysProcess_Execute(cp);
  tempOutput.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  tempOutput.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  tempOutput.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  tempError.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  tempError.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  tempError.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  cmProcessOutput::cmProcessOutput(&processOutput,encoding,0x400);
  strdata._M_dataplus._M_p = (pointer)&strdata.field_2;
  strdata._M_string_length = 0;
  strdata.field_2._M_local_buf[0] = '\0';
  do {
    uVar2 = cmsysProcess_WaitForData(cp,&data,&length,(double *)0x0);
    if (uVar2 == 2) {
      std::vector<char,std::allocator<char>>::insert<char*,void>
                ((vector<char,std::allocator<char>> *)&tempOutput,
                 (const_iterator)
                 tempOutput.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_finish,data,data + length);
LAB_0014bb88:
      bVar7 = false;
    }
    else {
      if (uVar2 == 3) {
        std::vector<char,std::allocator<char>>::insert<char*,void>
                  ((vector<char,std::allocator<char>> *)&tempError,
                   (const_iterator)
                   tempError.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_finish,data,data + length);
        goto LAB_0014bb88;
      }
      bVar7 = true;
      if ((uVar2 & 0xfffffffe) != 2) break;
    }
    if (local_2b0->ExtraVerbose == true) {
      cmProcessOutput::DecodeText(&processOutput,data,(long)length,&strdata,0);
      cmSystemTools::Stdout(&strdata);
    }
  } while (!bVar7);
  if (local_2b0->ExtraVerbose == true) {
    local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
    local_1c8._M_string_length = 0;
    local_1c8.field_2._M_local_buf[0] = '\0';
    cmProcessOutput::DecodeText(&processOutput,&local_1c8,&strdata,0);
    std::__cxx11::string::~string((string *)&local_1c8);
    if (strdata._M_string_length != 0) {
      cmSystemTools::Stdout(&strdata);
    }
  }
  cmsysProcess_WaitForExit(cp,(double *)0x0);
  if (tempOutput.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      tempOutput.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    std::vector<char,_std::allocator<char>_>::vector
              ((vector<char,_std::allocator<char>_> *)&local_1e0,&tempOutput);
    cmProcessOutput::DecodeText
              (&processOutput,(vector<char,_std::allocator<char>_> *)&local_1e0,&tempOutput,0);
    std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base(&local_1e0);
    std::__cxx11::string::append
              ((char *)local_260,
               (ulong)tempOutput.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start);
  }
  if (tempError.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      tempError.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    std::vector<char,_std::allocator<char>_>::vector
              ((vector<char,_std::allocator<char>_> *)&local_1f8,&tempError);
    cmProcessOutput::DecodeText
              (&processOutput,(vector<char,_std::allocator<char>_> *)&local_1f8,&tempError,0);
    std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base(&local_1f8);
    std::__cxx11::string::append
              ((char *)local_2b8,
               (ulong)tempError.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start);
  }
  iVar3 = cmsysProcess_GetState(cp);
  if (iVar3 == 4) {
    if (local_268 == (int *)0x0) {
      iVar3 = cmsysProcess_GetExitValue(cp);
      bVar7 = iVar3 == 0;
    }
    else {
      iVar3 = cmsysProcess_GetExitValue(cp);
      *local_268 = iVar3;
      bVar7 = true;
    }
  }
  else {
    iVar3 = cmsysProcess_GetState(cp);
    if (iVar3 == 2) {
      pcVar4 = cmsysProcess_GetExceptionString(cp);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
      poVar5 = std::operator<<((ostream *)&cmCTestLog_msg,pcVar4);
      std::endl<char,std::char_traits<char>>(poVar5);
      std::__cxx11::stringbuf::str();
      Log(local_2b0,7,
          "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmCTest.cxx",
          0xb19,local_258[0],false);
      std::__cxx11::string::~string((string *)local_258);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
      strlen(pcVar4);
      std::__cxx11::string::append((char *)local_2b8,(ulong)pcVar4);
    }
    else {
      iVar3 = cmsysProcess_GetState(cp);
      if (iVar3 == 1) {
        pcVar4 = cmsysProcess_GetErrorString(cp);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
        poVar5 = std::operator<<((ostream *)&cmCTestLog_msg,pcVar4);
        std::endl<char,std::char_traits<char>>(poVar5);
        std::__cxx11::stringbuf::str();
        Log(local_2b0,7,
            "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmCTest.cxx"
            ,0xb1e,local_258[0],false);
        std::__cxx11::string::~string((string *)local_258);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
        strlen(pcVar4);
        std::__cxx11::string::append((char *)local_2b8,(ulong)pcVar4);
      }
      else {
        iVar3 = cmsysProcess_GetState(cp);
        bVar7 = true;
        if (iVar3 != 5) goto LAB_0014bf19;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
        poVar5 = std::operator<<((ostream *)&cmCTestLog_msg,"Process terminated due to timeout\n");
        std::endl<char,std::char_traits<char>>(poVar5);
        std::__cxx11::stringbuf::str();
        Log(local_2b0,7,
            "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmCTest.cxx"
            ,0xb23,local_258[0],false);
        std::__cxx11::string::~string((string *)local_258);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
        std::__cxx11::string::append((char *)local_2b8,0x44fa26);
      }
    }
    bVar7 = false;
  }
LAB_0014bf19:
  cmsysProcess_Delete(cp);
  std::__cxx11::string::~string((string *)&strdata);
  cmProcessOutput::~cmProcessOutput(&processOutput);
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            (&tempError.super__Vector_base<char,_std::allocator<char>_>);
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            (&tempOutput.super__Vector_base<char,_std::allocator<char>_>);
  std::_Vector_base<const_char_*,_std::allocator<const_char_*>_>::~_Vector_base
            (&argv.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>);
  return bVar7;
}

Assistant:

bool cmCTest::RunCommand(std::vector<std::string> const& args,
                         std::string* stdOut, std::string* stdErr, int* retVal,
                         const char* dir, cmDuration timeout,
                         Encoding encoding)
{
  std::vector<const char*> argv;
  argv.reserve(args.size() + 1);
  for (std::string const& a : args) {
    argv.push_back(a.c_str());
  }
  argv.push_back(nullptr);

  stdOut->clear();
  stdErr->clear();

  cmsysProcess* cp = cmsysProcess_New();
  cmsysProcess_SetCommand(cp, argv.data());
  cmsysProcess_SetWorkingDirectory(cp, dir);
  if (cmSystemTools::GetRunCommandHideConsole()) {
    cmsysProcess_SetOption(cp, cmsysProcess_Option_HideWindow, 1);
  }
  cmsysProcess_SetTimeout(cp, timeout.count());
  cmsysProcess_Execute(cp);

  std::vector<char> tempOutput;
  std::vector<char> tempError;
  char* data;
  int length;
  cmProcessOutput processOutput(encoding);
  std::string strdata;
  int res;
  bool done = false;
  while (!done) {
    res = cmsysProcess_WaitForData(cp, &data, &length, nullptr);
    switch (res) {
      case cmsysProcess_Pipe_STDOUT:
        tempOutput.insert(tempOutput.end(), data, data + length);
        break;
      case cmsysProcess_Pipe_STDERR:
        tempError.insert(tempError.end(), data, data + length);
        break;
      default:
        done = true;
    }
    if ((res == cmsysProcess_Pipe_STDOUT || res == cmsysProcess_Pipe_STDERR) &&
        this->ExtraVerbose) {
      processOutput.DecodeText(data, length, strdata);
      cmSystemTools::Stdout(strdata);
    }
  }
  if (this->ExtraVerbose) {
    processOutput.DecodeText(std::string(), strdata);
    if (!strdata.empty()) {
      cmSystemTools::Stdout(strdata);
    }
  }

  cmsysProcess_WaitForExit(cp, nullptr);
  if (!tempOutput.empty()) {
    processOutput.DecodeText(tempOutput, tempOutput);
    stdOut->append(tempOutput.data(), tempOutput.size());
  }
  if (!tempError.empty()) {
    processOutput.DecodeText(tempError, tempError);
    stdErr->append(tempError.data(), tempError.size());
  }

  bool result = true;
  if (cmsysProcess_GetState(cp) == cmsysProcess_State_Exited) {
    if (retVal) {
      *retVal = cmsysProcess_GetExitValue(cp);
    } else {
      if (cmsysProcess_GetExitValue(cp) != 0) {
        result = false;
      }
    }
  } else if (cmsysProcess_GetState(cp) == cmsysProcess_State_Exception) {
    const char* exception_str = cmsysProcess_GetExceptionString(cp);
    cmCTestLog(this, ERROR_MESSAGE, exception_str << std::endl);
    stdErr->append(exception_str, strlen(exception_str));
    result = false;
  } else if (cmsysProcess_GetState(cp) == cmsysProcess_State_Error) {
    const char* error_str = cmsysProcess_GetErrorString(cp);
    cmCTestLog(this, ERROR_MESSAGE, error_str << std::endl);
    stdErr->append(error_str, strlen(error_str));
    result = false;
  } else if (cmsysProcess_GetState(cp) == cmsysProcess_State_Expired) {
    const char* error_str = "Process terminated due to timeout\n";
    cmCTestLog(this, ERROR_MESSAGE, error_str << std::endl);
    stdErr->append(error_str, strlen(error_str));
    result = false;
  }

  cmsysProcess_Delete(cp);
  return result;
}